

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ostream * CLI::detail::format_help(ostream *out,string *name,string *description,size_t wid)

{
  char cVar1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  size_type sVar5;
  reference pcVar6;
  ulong in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  int __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char c;
  const_iterator __end3;
  const_iterator __begin3;
  string *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58 [2];
  int local_48;
  int local_44;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  ::std::operator+((char *)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  ::std::__cxx11::string::~string(in_stack_ffffffffffffff80);
  __n = (int)in_RCX;
  this = in_RDI;
  local_44 = (int)std::setw(__n);
  poVar4 = ::std::operator<<((ostream *)this,(_Setw)local_44);
  poVar4 = (ostream *)::std::ostream::operator<<(poVar4,std::left);
  ::std::operator<<(poVar4,(string *)in_RSI);
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c4914);
  if (!bVar2) {
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (in_RSI);
    if (in_RCX <= sVar5) {
      in_stack_ffffffffffffff80 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ::std::operator<<((ostream *)in_RDI,"\n");
      local_48 = (int)std::setw(__n);
      poVar4 = ::std::operator<<((ostream *)in_stack_ffffffffffffff80,(_Setw)local_48);
      ::std::operator<<(poVar4,"");
    }
    local_58[0]._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin(in_stack_ffffffffffffff78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(this);
    while (bVar2 = __gnu_cxx::
                   operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff80,
                              (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)in_stack_ffffffffffffff78), ((bVar2 ^ 0xffU) & 1) != 0) {
      pcVar6 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_58);
      cVar1 = *pcVar6;
      ::std::ostream::put((char)in_RDI);
      if (cVar1 == '\n') {
        in_stack_ffffffffffffff78 = in_RDI;
        _Var3 = std::setw(__n);
        poVar4 = ::std::operator<<((ostream *)in_stack_ffffffffffffff78,_Var3);
        ::std::operator<<(poVar4,"");
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_58);
    }
  }
  ::std::operator<<((ostream *)in_RDI,"\n");
  return (ostream *)in_RDI;
}

Assistant:

CLI11_INLINE std::ostream &
format_help(std::ostream &out, std::string name, const std::string &description, std::size_t wid) {
    name = "  " + name;
    out << std::setw(static_cast<int>(wid)) << std::left << name;
    if(!description.empty()) {
        if(name.length() >= wid)
            out << "\n" << std::setw(static_cast<int>(wid)) << "";
        for(const char c : description) {
            out.put(c);
            if(c == '\n') {
                out << std::setw(static_cast<int>(wid)) << "";
            }
        }
    }
    out << "\n";
    return out;
}